

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorRotationSpeed.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkMotorRotationSpeed::ArchiveIN(ChLinkMotorRotationSpeed *this,ChArchiveIn *marchive)

{
  ChNameValue<bool> local_48;
  ChNameValue<double> local_30;
  
  ChArchiveIn::VersionRead<chrono::ChLinkMotorRotationSpeed>(marchive);
  ChLinkMotorRotation::ArchiveIN(&this->super_ChLinkMotorRotation,marchive);
  local_30._value = (double *)&(this->super_ChLinkMotorRotation).field_0x278;
  local_30._name = "rot_offset";
  local_30._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_30);
  local_48._value = &this->avoid_angle_drift;
  local_48._name = "avoid_angle_drift";
  local_48._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_48);
  return;
}

Assistant:

void ChLinkMotorRotationSpeed::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChLinkMotorRotationSpeed>();

    // deserialize parent class
    ChLinkMotorRotation::ArchiveIN(marchive);

    // deserialize all member data:
    marchive >> CHNVP(rot_offset);
    marchive >> CHNVP(avoid_angle_drift);
}